

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTestCase.cpp
# Opt level: O1

void __thiscall SuiteDictionaryTests::TestsetGetDay::~TestsetGetDay(TestsetGetDay *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(setGetDay)
{
  Dictionary object;
  object.setString( "DAY1", "SU" );
  object.setString( "DAY2", "MO" );
  object.setString( "DAY3", "TU" );
  object.setString( "DAY4", "WE" );
  object.setString( "DAY5", "TH" );
  object.setString( "DAY6", "FR" );
  object.setString( "DAY7", "SA" );
  object.setString( "DAYUNKNOWN", "un" );
  object.setString( "DAYBAD", "f" );

  CHECK_EQUAL( 1, object.getDay( "DAY1" ) );
  CHECK_EQUAL( 2, object.getDay( "DAY2" ) );
  CHECK_EQUAL( 3, object.getDay( "DAY3" ) );
  CHECK_EQUAL( 4, object.getDay( "DAY4" ) );
  CHECK_EQUAL( 5, object.getDay( "DAY5" ) );
  CHECK_EQUAL( 6, object.getDay( "DAY6" ) );
  CHECK_EQUAL( 7, object.getDay( "DAY7" ) );
  CHECK_EQUAL( -1, object.getDay( "DAYUNKNOWN" ) );
  CHECK_THROW( object.getDay( "DAYBAD" ), ConfigError );

  object.setDay( "NEXTDAY1", 1 );
  object.setDay( "NEXTDAY2", 2 );
  object.setDay( "NEXTDAY3", 3 );
  object.setDay( "NEXTDAY4", 4 );
  object.setDay( "NEXTDAY5", 5 );
  object.setDay( "NEXTDAY6", 6 );
  object.setDay( "NEXTDAY7", 7 );
  object.setDay( "NEXTDAYBAD", 8 );

  CHECK_EQUAL( 1, object.getDay( "NEXTDAY1" ) );
  CHECK_EQUAL( 2, object.getDay( "NEXTDAY2" ) );
  CHECK_EQUAL( 3, object.getDay( "NEXTDAY3" ) );
  CHECK_EQUAL( 4, object.getDay( "NEXTDAY4" ) );
  CHECK_EQUAL( 5, object.getDay( "NEXTDAY5" ) );
  CHECK_EQUAL( 6, object.getDay( "NEXTDAY6" ) );
  CHECK_EQUAL( 7, object.getDay( "NEXTDAY7" ) );
}